

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall SQSharedState::SQSharedState(SQSharedState *this)

{
  long in_RDI;
  
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 8));
  RefTable::RefTable((RefTable *)0x134d9d);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0x58));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0x68));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0x78));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0x90));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0xa0));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0xb0));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0xc0));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0xd0));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0xe0));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0xf0));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0x100));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0x110));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0x120));
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0x130));
  *(undefined8 *)(in_RDI + 0x140) = 0;
  *(undefined8 *)(in_RDI + 0x148) = 0;
  *(undefined8 *)(in_RDI + 0x150) = 0;
  *(undefined1 *)(in_RDI + 0x158) = 0;
  *(undefined1 *)(in_RDI + 0x159) = 0;
  *(undefined8 *)(in_RDI + 0x160) = 0;
  *(undefined8 *)(in_RDI + 0x168) = 0;
  return;
}

Assistant:

SQSharedState::SQSharedState()
{
    _compilererrorhandler = NULL;
    _printfunc = NULL;
    _errorfunc = NULL;
    _debuginfo = false;
    _notifyallexceptions = false;
    _foreignptr = NULL;
    _releasehook = NULL;
}